

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoPrintClasses(Gia_IsoMan_t *p)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int i;
  
  lVar1 = (long)p->vClasses->nSize;
  printf("The total of %d classes:\n",lVar1 / 2 & 0xffffffff,lVar1 % 2 & 0xffffffff);
  i = 1;
  uVar4 = 0;
  while( true ) {
    if (p->vClasses->nSize <= i) break;
    uVar2 = Vec_IntEntry(p->vClasses,i + -1);
    uVar3 = Vec_IntEntry(p->vClasses,i);
    printf("%5d : (%3d,%3d)  ",uVar4,(ulong)uVar2,(ulong)uVar3);
    putchar(10);
    uVar4 = (ulong)((int)uVar4 + 1);
    i = i + 2;
  }
  return;
}

Assistant:

void Gia_IsoPrintClasses( Gia_IsoMan_t * p )
{
    int fVerbose = 0;
    int i, k, iBegin, nSize;
    printf( "The total of %d classes:\n", Vec_IntSize(p->vClasses)/2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        printf( "%5d : (%3d,%3d)  ", i/2, iBegin, nSize );
        if ( fVerbose )
        {
            printf( "{" );
            for ( k = 0; k < nSize; k++ )
                printf( " %3d,%08x", Gia_IsoGetItem(p, iBegin+k), Gia_IsoGetValue(p, iBegin+k) );
            printf( " }" );
        }
        printf( "\n" );
    }
}